

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O2

bool chaiscript::dispatch::detail::
     compare_types_cast<void,chaiscript::Type_Info_const&,chaiscript::Type_Info_const&,std::function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>const&,0ul,1ul,2ul>
               (undefined8 param_1,long *param_2,Type_Conversions_State *param_3,
               Type_Conversions_State *param_4)

{
  Result_Type local_30;
  
  boxed_cast<chaiscript::Type_Info_const&>((Boxed_Value *)*param_2,param_3);
  boxed_cast<chaiscript::Type_Info_const&>((Boxed_Value *)(*param_2 + 0x10),param_3);
  boxed_cast<std::function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>const&>
            (&local_30,(chaiscript *)(*param_2 + 0x20),(Boxed_Value *)param_3,param_4);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  return true;
}

Assistant:

bool compare_types_cast(Indexes<I...>, Ret (*)(Params...),
             const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          try {
            (void)params; (void)t_conversions;
            (void)std::initializer_list<int>{(boxed_cast<Params>(params[I], &t_conversions), 0)...};
            return true;
          } catch (const exception::bad_boxed_cast &) {
            return false;
          }

        }